

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_popcnt(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  uint uVar257;
  long lVar258;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  int i_3;
  int j_1;
  size_t i_2;
  int j;
  size_t i_1;
  uint32_t pos;
  uint32_t n_cycles_updates;
  uint32_t n_cycles;
  __m256i *data_vectors;
  uint32_t out_counters [16];
  int i;
  __m256i stubs [16];
  __m256i masks [16];
  int iStack_10da8;
  int iStack_10da4;
  ulong uStack_10da0;
  int iStack_10d94;
  ulong uStack_10d90;
  uint uStack_10d84;
  int aiStack_10d70 [19];
  uint uStack_10d24;
  undefined1 auStack_10d20 [32];
  undefined1 auStack_10d00 [32];
  undefined1 auStack_10ce0 [32];
  undefined1 auStack_10cc0 [32];
  undefined1 auStack_10ca0 [32];
  undefined1 auStack_10c80 [32];
  undefined1 auStack_10c60 [32];
  undefined1 auStack_10c40 [32];
  undefined1 auStack_10c20 [32];
  undefined1 auStack_10c00 [32];
  undefined1 auStack_10be0 [32];
  undefined1 auStack_10bc0 [32];
  undefined1 auStack_10ba0 [32];
  undefined1 auStack_10b80 [32];
  undefined1 auStack_10b60 [32];
  undefined1 auStack_10b40 [32];
  long alStack_10b20 [65];
  uint uStack_10914;
  long lStack_10910;
  undefined2 uStack_10904;
  ushort uStack_10902;
  long local_100;
  long lStack_f8;
  long lStack_f0;
  long lStack_e8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  alStack_10b20[0x40] = in_RDX;
  uStack_10914 = in_ESI;
  lStack_10910 = in_RDI;
  for (uStack_10d24 = 0; (int)uStack_10d24 < 0x10; uStack_10d24 = uStack_10d24 + 1) {
    uVar257 = 1 << (uStack_10d24 & 0x1f);
    uStack_10902 = (ushort)uVar257;
    auVar260 = vpinsrw_avx(ZEXT216(uStack_10902),uVar257 & 0xffff,1);
    auVar260 = vpinsrw_avx(auVar260,uVar257 & 0xffff,2);
    auVar260 = vpinsrw_avx(auVar260,uVar257 & 0xffff,3);
    auVar260 = vpinsrw_avx(auVar260,uVar257 & 0xffff,4);
    auVar260 = vpinsrw_avx(auVar260,uVar257 & 0xffff,5);
    auVar260 = vpinsrw_avx(auVar260,uVar257 & 0xffff,6);
    auVar260 = vpinsrw_avx(auVar260,uVar257 & 0xffff,7);
    auVar259 = vpinsrw_avx(ZEXT216(uStack_10902),uVar257 & 0xffff,1);
    auVar259 = vpinsrw_avx(auVar259,uVar257 & 0xffff,2);
    auVar259 = vpinsrw_avx(auVar259,uVar257 & 0xffff,3);
    auVar259 = vpinsrw_avx(auVar259,uVar257 & 0xffff,4);
    auVar259 = vpinsrw_avx(auVar259,uVar257 & 0xffff,5);
    auVar259 = vpinsrw_avx(auVar259,uVar257 & 0xffff,6);
    auVar259 = vpinsrw_avx(auVar259,uVar257 & 0xffff,7);
    local_100 = auVar260._0_8_;
    lStack_f8 = auVar260._8_8_;
    lStack_f0 = auVar259._0_8_;
    lStack_e8 = auVar259._8_8_;
    lVar258 = (long)(int)uStack_10d24;
    alStack_10b20[lVar258 * 4] = local_100;
    alStack_10b20[lVar258 * 4 + 1] = lStack_f8;
    alStack_10b20[lVar258 * 4 + 2] = lStack_f0;
    alStack_10b20[lVar258 * 4 + 3] = lStack_e8;
    uStack_10904 = 0;
    auVar260 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar260 = vpinsrw_avx(auVar260,0,2);
    auVar260 = vpinsrw_avx(auVar260,0,3);
    auVar260 = vpinsrw_avx(auVar260,0,4);
    auVar260 = vpinsrw_avx(auVar260,0,5);
    auVar260 = vpinsrw_avx(auVar260,0,6);
    auVar260 = vpinsrw_avx(auVar260,0,7);
    auVar259 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar259 = vpinsrw_avx(auVar259,0,2);
    auVar259 = vpinsrw_avx(auVar259,0,3);
    auVar259 = vpinsrw_avx(auVar259,0,4);
    auVar259 = vpinsrw_avx(auVar259,0,5);
    auVar259 = vpinsrw_avx(auVar259,0,6);
    auVar259 = vpinsrw_avx(auVar259,0,7);
    auVar259 = ZEXT116(0) * auVar260 + ZEXT116(1) * auVar259;
    auVar260 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar260;
    local_c0 = auVar259._0_8_;
    uStack_b8 = auVar259._8_8_;
    uStack_b0 = auVar260._0_8_;
    uStack_a8 = auVar260._8_8_;
    lVar258 = (long)(int)uStack_10d24 * 0x20;
    *(undefined8 *)(auStack_10d20 + lVar258) = local_c0;
    *(undefined8 *)(auStack_10d20 + lVar258 + 8) = uStack_b8;
    *(undefined8 *)(auStack_10d20 + lVar258 + 0x10) = uStack_b0;
    *(undefined8 *)(auStack_10d00 + lVar258 + -8) = uStack_a8;
  }
  memset(aiStack_10d70,0,0x40);
  uStack_10d84 = 0;
  for (uStack_10d90 = 0; uStack_10d90 < uStack_10914 >> 8; uStack_10d90 = uStack_10d90 + 1) {
    auVar256._8_8_ = alStack_10b20[1];
    auVar256._0_8_ = alStack_10b20[0];
    auVar256._16_8_ = alStack_10b20[2];
    auVar256._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar256);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar2 = vpor_avx2(auStack_10d20,auVar1);
    auVar255._8_8_ = alStack_10b20[5];
    auVar255._0_8_ = alStack_10b20[4];
    auVar255._16_8_ = alStack_10b20[6];
    auVar255._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar255);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar3 = vpor_avx2(auStack_10d00,auVar1);
    auVar254._8_8_ = alStack_10b20[9];
    auVar254._0_8_ = alStack_10b20[8];
    auVar254._16_8_ = alStack_10b20[10];
    auVar254._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar254);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar4 = vpor_avx2(auStack_10ce0,auVar1);
    auVar253._8_8_ = alStack_10b20[0xd];
    auVar253._0_8_ = alStack_10b20[0xc];
    auVar253._16_8_ = alStack_10b20[0xe];
    auVar253._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar253);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar5 = vpor_avx2(auStack_10cc0,auVar1);
    auVar252._8_8_ = alStack_10b20[0x11];
    auVar252._0_8_ = alStack_10b20[0x10];
    auVar252._16_8_ = alStack_10b20[0x12];
    auVar252._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar252);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar6 = vpor_avx2(auStack_10ca0,auVar1);
    auVar251._8_8_ = alStack_10b20[0x15];
    auVar251._0_8_ = alStack_10b20[0x14];
    auVar251._16_8_ = alStack_10b20[0x16];
    auVar251._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar251);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar7 = vpor_avx2(auStack_10c80,auVar1);
    auVar250._8_8_ = alStack_10b20[0x19];
    auVar250._0_8_ = alStack_10b20[0x18];
    auVar250._16_8_ = alStack_10b20[0x1a];
    auVar250._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar250);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar8 = vpor_avx2(auStack_10c60,auVar1);
    auVar9._8_8_ = alStack_10b20[0x1d];
    auVar9._0_8_ = alStack_10b20[0x1c];
    auVar9._16_8_ = alStack_10b20[0x1e];
    auVar9._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar9);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar9 = vpor_avx2(auStack_10c40,auVar1);
    auVar10._8_8_ = alStack_10b20[0x21];
    auVar10._0_8_ = alStack_10b20[0x20];
    auVar10._16_8_ = alStack_10b20[0x22];
    auVar10._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar10);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar10 = vpor_avx2(auStack_10c20,auVar1);
    auVar11._8_8_ = alStack_10b20[0x25];
    auVar11._0_8_ = alStack_10b20[0x24];
    auVar11._16_8_ = alStack_10b20[0x26];
    auVar11._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar11);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar11 = vpor_avx2(auStack_10c00,auVar1);
    auVar12._8_8_ = alStack_10b20[0x29];
    auVar12._0_8_ = alStack_10b20[0x28];
    auVar12._16_8_ = alStack_10b20[0x2a];
    auVar12._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar12);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar12 = vpor_avx2(auStack_10be0,auVar1);
    auVar13._8_8_ = alStack_10b20[0x2d];
    auVar13._0_8_ = alStack_10b20[0x2c];
    auVar13._16_8_ = alStack_10b20[0x2e];
    auVar13._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar13);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar13 = vpor_avx2(auStack_10bc0,auVar1);
    auVar14._8_8_ = alStack_10b20[0x31];
    auVar14._0_8_ = alStack_10b20[0x30];
    auVar14._16_8_ = alStack_10b20[0x32];
    auVar14._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar14);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar14 = vpor_avx2(auStack_10ba0,auVar1);
    auVar15._8_8_ = alStack_10b20[0x35];
    auVar15._0_8_ = alStack_10b20[0x34];
    auVar15._16_8_ = alStack_10b20[0x36];
    auVar15._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar15);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar15 = vpor_avx2(auStack_10b80,auVar1);
    auVar16._8_8_ = alStack_10b20[0x39];
    auVar16._0_8_ = alStack_10b20[0x38];
    auVar16._16_8_ = alStack_10b20[0x3a];
    auVar16._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar16);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar16 = vpor_avx2(auStack_10b60,auVar1);
    auVar17._8_8_ = alStack_10b20[0x3d];
    auVar17._0_8_ = alStack_10b20[0x3c];
    auVar17._16_8_ = alStack_10b20[0x3e];
    auVar17._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uStack_10d84 * 0x20),auVar17);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0));
    auVar17 = vpor_avx2(auStack_10b40,auVar1);
    uVar257 = uStack_10d84 + 1;
    auVar249._8_8_ = alStack_10b20[1];
    auVar249._0_8_ = alStack_10b20[0];
    auVar249._16_8_ = alStack_10b20[2];
    auVar249._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar249);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar248._8_8_ = alStack_10b20[5];
    auVar248._0_8_ = alStack_10b20[4];
    auVar248._16_8_ = alStack_10b20[6];
    auVar248._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar248);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar247._8_8_ = alStack_10b20[9];
    auVar247._0_8_ = alStack_10b20[8];
    auVar247._16_8_ = alStack_10b20[10];
    auVar247._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar247);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar246._8_8_ = alStack_10b20[0xd];
    auVar246._0_8_ = alStack_10b20[0xc];
    auVar246._16_8_ = alStack_10b20[0xe];
    auVar246._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar246);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar245._8_8_ = alStack_10b20[0x11];
    auVar245._0_8_ = alStack_10b20[0x10];
    auVar245._16_8_ = alStack_10b20[0x12];
    auVar245._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar245);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar244._8_8_ = alStack_10b20[0x15];
    auVar244._0_8_ = alStack_10b20[0x14];
    auVar244._16_8_ = alStack_10b20[0x16];
    auVar244._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar244);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar243._8_8_ = alStack_10b20[0x19];
    auVar243._0_8_ = alStack_10b20[0x18];
    auVar243._16_8_ = alStack_10b20[0x1a];
    auVar243._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar243);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar242._8_8_ = alStack_10b20[0x1d];
    auVar242._0_8_ = alStack_10b20[0x1c];
    auVar242._16_8_ = alStack_10b20[0x1e];
    auVar242._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar242);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar241._8_8_ = alStack_10b20[0x21];
    auVar241._0_8_ = alStack_10b20[0x20];
    auVar241._16_8_ = alStack_10b20[0x22];
    auVar241._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar241);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar240._8_8_ = alStack_10b20[0x25];
    auVar240._0_8_ = alStack_10b20[0x24];
    auVar240._16_8_ = alStack_10b20[0x26];
    auVar240._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar240);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar239._8_8_ = alStack_10b20[0x29];
    auVar239._0_8_ = alStack_10b20[0x28];
    auVar239._16_8_ = alStack_10b20[0x2a];
    auVar239._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar239);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar238._8_8_ = alStack_10b20[0x2d];
    auVar238._0_8_ = alStack_10b20[0x2c];
    auVar238._16_8_ = alStack_10b20[0x2e];
    auVar238._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar238);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar237._8_8_ = alStack_10b20[0x31];
    auVar237._0_8_ = alStack_10b20[0x30];
    auVar237._16_8_ = alStack_10b20[0x32];
    auVar237._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar237);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar236._8_8_ = alStack_10b20[0x35];
    auVar236._0_8_ = alStack_10b20[0x34];
    auVar236._16_8_ = alStack_10b20[0x36];
    auVar236._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar236);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar235._8_8_ = alStack_10b20[0x39];
    auVar235._0_8_ = alStack_10b20[0x38];
    auVar235._16_8_ = alStack_10b20[0x3a];
    auVar235._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar235);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar234._8_8_ = alStack_10b20[0x3d];
    auVar234._0_8_ = alStack_10b20[0x3c];
    auVar234._16_8_ = alStack_10b20[0x3e];
    auVar234._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar234);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(1));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 2;
    auVar233._8_8_ = alStack_10b20[1];
    auVar233._0_8_ = alStack_10b20[0];
    auVar233._16_8_ = alStack_10b20[2];
    auVar233._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar233);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar232._8_8_ = alStack_10b20[5];
    auVar232._0_8_ = alStack_10b20[4];
    auVar232._16_8_ = alStack_10b20[6];
    auVar232._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar232);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar231._8_8_ = alStack_10b20[9];
    auVar231._0_8_ = alStack_10b20[8];
    auVar231._16_8_ = alStack_10b20[10];
    auVar231._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar231);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar230._8_8_ = alStack_10b20[0xd];
    auVar230._0_8_ = alStack_10b20[0xc];
    auVar230._16_8_ = alStack_10b20[0xe];
    auVar230._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar230);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar229._8_8_ = alStack_10b20[0x11];
    auVar229._0_8_ = alStack_10b20[0x10];
    auVar229._16_8_ = alStack_10b20[0x12];
    auVar229._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar229);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar228._8_8_ = alStack_10b20[0x15];
    auVar228._0_8_ = alStack_10b20[0x14];
    auVar228._16_8_ = alStack_10b20[0x16];
    auVar228._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar228);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar227._8_8_ = alStack_10b20[0x19];
    auVar227._0_8_ = alStack_10b20[0x18];
    auVar227._16_8_ = alStack_10b20[0x1a];
    auVar227._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar227);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar226._8_8_ = alStack_10b20[0x1d];
    auVar226._0_8_ = alStack_10b20[0x1c];
    auVar226._16_8_ = alStack_10b20[0x1e];
    auVar226._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar226);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar225._8_8_ = alStack_10b20[0x21];
    auVar225._0_8_ = alStack_10b20[0x20];
    auVar225._16_8_ = alStack_10b20[0x22];
    auVar225._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar225);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar224._8_8_ = alStack_10b20[0x25];
    auVar224._0_8_ = alStack_10b20[0x24];
    auVar224._16_8_ = alStack_10b20[0x26];
    auVar224._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar224);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar223._8_8_ = alStack_10b20[0x29];
    auVar223._0_8_ = alStack_10b20[0x28];
    auVar223._16_8_ = alStack_10b20[0x2a];
    auVar223._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar223);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar222._8_8_ = alStack_10b20[0x2d];
    auVar222._0_8_ = alStack_10b20[0x2c];
    auVar222._16_8_ = alStack_10b20[0x2e];
    auVar222._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar222);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar221._8_8_ = alStack_10b20[0x31];
    auVar221._0_8_ = alStack_10b20[0x30];
    auVar221._16_8_ = alStack_10b20[0x32];
    auVar221._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar221);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar220._8_8_ = alStack_10b20[0x35];
    auVar220._0_8_ = alStack_10b20[0x34];
    auVar220._16_8_ = alStack_10b20[0x36];
    auVar220._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar220);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar219._8_8_ = alStack_10b20[0x39];
    auVar219._0_8_ = alStack_10b20[0x38];
    auVar219._16_8_ = alStack_10b20[0x3a];
    auVar219._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar219);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar218._8_8_ = alStack_10b20[0x3d];
    auVar218._0_8_ = alStack_10b20[0x3c];
    auVar218._16_8_ = alStack_10b20[0x3e];
    auVar218._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar218);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 3;
    auVar217._8_8_ = alStack_10b20[1];
    auVar217._0_8_ = alStack_10b20[0];
    auVar217._16_8_ = alStack_10b20[2];
    auVar217._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar217);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar216._8_8_ = alStack_10b20[5];
    auVar216._0_8_ = alStack_10b20[4];
    auVar216._16_8_ = alStack_10b20[6];
    auVar216._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar216);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar215._8_8_ = alStack_10b20[9];
    auVar215._0_8_ = alStack_10b20[8];
    auVar215._16_8_ = alStack_10b20[10];
    auVar215._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar215);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar214._8_8_ = alStack_10b20[0xd];
    auVar214._0_8_ = alStack_10b20[0xc];
    auVar214._16_8_ = alStack_10b20[0xe];
    auVar214._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar214);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar213._8_8_ = alStack_10b20[0x11];
    auVar213._0_8_ = alStack_10b20[0x10];
    auVar213._16_8_ = alStack_10b20[0x12];
    auVar213._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar213);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar212._8_8_ = alStack_10b20[0x15];
    auVar212._0_8_ = alStack_10b20[0x14];
    auVar212._16_8_ = alStack_10b20[0x16];
    auVar212._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar212);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar211._8_8_ = alStack_10b20[0x19];
    auVar211._0_8_ = alStack_10b20[0x18];
    auVar211._16_8_ = alStack_10b20[0x1a];
    auVar211._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar211);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar210._8_8_ = alStack_10b20[0x1d];
    auVar210._0_8_ = alStack_10b20[0x1c];
    auVar210._16_8_ = alStack_10b20[0x1e];
    auVar210._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar210);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar209._8_8_ = alStack_10b20[0x21];
    auVar209._0_8_ = alStack_10b20[0x20];
    auVar209._16_8_ = alStack_10b20[0x22];
    auVar209._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar209);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar208._8_8_ = alStack_10b20[0x25];
    auVar208._0_8_ = alStack_10b20[0x24];
    auVar208._16_8_ = alStack_10b20[0x26];
    auVar208._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar208);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar207._8_8_ = alStack_10b20[0x29];
    auVar207._0_8_ = alStack_10b20[0x28];
    auVar207._16_8_ = alStack_10b20[0x2a];
    auVar207._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar207);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar206._8_8_ = alStack_10b20[0x2d];
    auVar206._0_8_ = alStack_10b20[0x2c];
    auVar206._16_8_ = alStack_10b20[0x2e];
    auVar206._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar206);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar205._8_8_ = alStack_10b20[0x31];
    auVar205._0_8_ = alStack_10b20[0x30];
    auVar205._16_8_ = alStack_10b20[0x32];
    auVar205._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar205);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar204._8_8_ = alStack_10b20[0x35];
    auVar204._0_8_ = alStack_10b20[0x34];
    auVar204._16_8_ = alStack_10b20[0x36];
    auVar204._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar204);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar203._8_8_ = alStack_10b20[0x39];
    auVar203._0_8_ = alStack_10b20[0x38];
    auVar203._16_8_ = alStack_10b20[0x3a];
    auVar203._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar203);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar202._8_8_ = alStack_10b20[0x3d];
    auVar202._0_8_ = alStack_10b20[0x3c];
    auVar202._16_8_ = alStack_10b20[0x3e];
    auVar202._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar202);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(3));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 4;
    auVar201._8_8_ = alStack_10b20[1];
    auVar201._0_8_ = alStack_10b20[0];
    auVar201._16_8_ = alStack_10b20[2];
    auVar201._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar201);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar200._8_8_ = alStack_10b20[5];
    auVar200._0_8_ = alStack_10b20[4];
    auVar200._16_8_ = alStack_10b20[6];
    auVar200._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar200);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar199._8_8_ = alStack_10b20[9];
    auVar199._0_8_ = alStack_10b20[8];
    auVar199._16_8_ = alStack_10b20[10];
    auVar199._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar199);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar198._8_8_ = alStack_10b20[0xd];
    auVar198._0_8_ = alStack_10b20[0xc];
    auVar198._16_8_ = alStack_10b20[0xe];
    auVar198._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar198);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar197._8_8_ = alStack_10b20[0x11];
    auVar197._0_8_ = alStack_10b20[0x10];
    auVar197._16_8_ = alStack_10b20[0x12];
    auVar197._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar197);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar196._8_8_ = alStack_10b20[0x15];
    auVar196._0_8_ = alStack_10b20[0x14];
    auVar196._16_8_ = alStack_10b20[0x16];
    auVar196._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar196);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar195._8_8_ = alStack_10b20[0x19];
    auVar195._0_8_ = alStack_10b20[0x18];
    auVar195._16_8_ = alStack_10b20[0x1a];
    auVar195._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar195);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar194._8_8_ = alStack_10b20[0x1d];
    auVar194._0_8_ = alStack_10b20[0x1c];
    auVar194._16_8_ = alStack_10b20[0x1e];
    auVar194._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar194);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar193._8_8_ = alStack_10b20[0x21];
    auVar193._0_8_ = alStack_10b20[0x20];
    auVar193._16_8_ = alStack_10b20[0x22];
    auVar193._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar193);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar192._8_8_ = alStack_10b20[0x25];
    auVar192._0_8_ = alStack_10b20[0x24];
    auVar192._16_8_ = alStack_10b20[0x26];
    auVar192._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar192);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar191._8_8_ = alStack_10b20[0x29];
    auVar191._0_8_ = alStack_10b20[0x28];
    auVar191._16_8_ = alStack_10b20[0x2a];
    auVar191._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar191);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar190._8_8_ = alStack_10b20[0x2d];
    auVar190._0_8_ = alStack_10b20[0x2c];
    auVar190._16_8_ = alStack_10b20[0x2e];
    auVar190._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar190);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar189._8_8_ = alStack_10b20[0x31];
    auVar189._0_8_ = alStack_10b20[0x30];
    auVar189._16_8_ = alStack_10b20[0x32];
    auVar189._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar189);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar188._8_8_ = alStack_10b20[0x35];
    auVar188._0_8_ = alStack_10b20[0x34];
    auVar188._16_8_ = alStack_10b20[0x36];
    auVar188._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar188);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar187._8_8_ = alStack_10b20[0x39];
    auVar187._0_8_ = alStack_10b20[0x38];
    auVar187._16_8_ = alStack_10b20[0x3a];
    auVar187._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar187);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar186._8_8_ = alStack_10b20[0x3d];
    auVar186._0_8_ = alStack_10b20[0x3c];
    auVar186._16_8_ = alStack_10b20[0x3e];
    auVar186._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar186);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 5;
    auVar185._8_8_ = alStack_10b20[1];
    auVar185._0_8_ = alStack_10b20[0];
    auVar185._16_8_ = alStack_10b20[2];
    auVar185._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar185);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar184._8_8_ = alStack_10b20[5];
    auVar184._0_8_ = alStack_10b20[4];
    auVar184._16_8_ = alStack_10b20[6];
    auVar184._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar184);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar183._8_8_ = alStack_10b20[9];
    auVar183._0_8_ = alStack_10b20[8];
    auVar183._16_8_ = alStack_10b20[10];
    auVar183._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar183);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar182._8_8_ = alStack_10b20[0xd];
    auVar182._0_8_ = alStack_10b20[0xc];
    auVar182._16_8_ = alStack_10b20[0xe];
    auVar182._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar182);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar181._8_8_ = alStack_10b20[0x11];
    auVar181._0_8_ = alStack_10b20[0x10];
    auVar181._16_8_ = alStack_10b20[0x12];
    auVar181._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar181);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar180._8_8_ = alStack_10b20[0x15];
    auVar180._0_8_ = alStack_10b20[0x14];
    auVar180._16_8_ = alStack_10b20[0x16];
    auVar180._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar180);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar179._8_8_ = alStack_10b20[0x19];
    auVar179._0_8_ = alStack_10b20[0x18];
    auVar179._16_8_ = alStack_10b20[0x1a];
    auVar179._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar179);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar178._8_8_ = alStack_10b20[0x1d];
    auVar178._0_8_ = alStack_10b20[0x1c];
    auVar178._16_8_ = alStack_10b20[0x1e];
    auVar178._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar178);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar177._8_8_ = alStack_10b20[0x21];
    auVar177._0_8_ = alStack_10b20[0x20];
    auVar177._16_8_ = alStack_10b20[0x22];
    auVar177._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar177);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar176._8_8_ = alStack_10b20[0x25];
    auVar176._0_8_ = alStack_10b20[0x24];
    auVar176._16_8_ = alStack_10b20[0x26];
    auVar176._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar176);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar175._8_8_ = alStack_10b20[0x29];
    auVar175._0_8_ = alStack_10b20[0x28];
    auVar175._16_8_ = alStack_10b20[0x2a];
    auVar175._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar175);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar174._8_8_ = alStack_10b20[0x2d];
    auVar174._0_8_ = alStack_10b20[0x2c];
    auVar174._16_8_ = alStack_10b20[0x2e];
    auVar174._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar174);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar173._8_8_ = alStack_10b20[0x31];
    auVar173._0_8_ = alStack_10b20[0x30];
    auVar173._16_8_ = alStack_10b20[0x32];
    auVar173._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar173);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar172._8_8_ = alStack_10b20[0x35];
    auVar172._0_8_ = alStack_10b20[0x34];
    auVar172._16_8_ = alStack_10b20[0x36];
    auVar172._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar172);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar171._8_8_ = alStack_10b20[0x39];
    auVar171._0_8_ = alStack_10b20[0x38];
    auVar171._16_8_ = alStack_10b20[0x3a];
    auVar171._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar171);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar170._8_8_ = alStack_10b20[0x3d];
    auVar170._0_8_ = alStack_10b20[0x3c];
    auVar170._16_8_ = alStack_10b20[0x3e];
    auVar170._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar170);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(5));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 6;
    auVar169._8_8_ = alStack_10b20[1];
    auVar169._0_8_ = alStack_10b20[0];
    auVar169._16_8_ = alStack_10b20[2];
    auVar169._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar169);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar168._8_8_ = alStack_10b20[5];
    auVar168._0_8_ = alStack_10b20[4];
    auVar168._16_8_ = alStack_10b20[6];
    auVar168._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar168);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar167._8_8_ = alStack_10b20[9];
    auVar167._0_8_ = alStack_10b20[8];
    auVar167._16_8_ = alStack_10b20[10];
    auVar167._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar167);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar166._8_8_ = alStack_10b20[0xd];
    auVar166._0_8_ = alStack_10b20[0xc];
    auVar166._16_8_ = alStack_10b20[0xe];
    auVar166._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar166);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar165._8_8_ = alStack_10b20[0x11];
    auVar165._0_8_ = alStack_10b20[0x10];
    auVar165._16_8_ = alStack_10b20[0x12];
    auVar165._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar165);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar164._8_8_ = alStack_10b20[0x15];
    auVar164._0_8_ = alStack_10b20[0x14];
    auVar164._16_8_ = alStack_10b20[0x16];
    auVar164._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar164);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar163._8_8_ = alStack_10b20[0x19];
    auVar163._0_8_ = alStack_10b20[0x18];
    auVar163._16_8_ = alStack_10b20[0x1a];
    auVar163._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar163);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar162._8_8_ = alStack_10b20[0x1d];
    auVar162._0_8_ = alStack_10b20[0x1c];
    auVar162._16_8_ = alStack_10b20[0x1e];
    auVar162._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar162);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar161._8_8_ = alStack_10b20[0x21];
    auVar161._0_8_ = alStack_10b20[0x20];
    auVar161._16_8_ = alStack_10b20[0x22];
    auVar161._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar161);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar160._8_8_ = alStack_10b20[0x25];
    auVar160._0_8_ = alStack_10b20[0x24];
    auVar160._16_8_ = alStack_10b20[0x26];
    auVar160._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar160);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar159._8_8_ = alStack_10b20[0x29];
    auVar159._0_8_ = alStack_10b20[0x28];
    auVar159._16_8_ = alStack_10b20[0x2a];
    auVar159._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar159);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar158._8_8_ = alStack_10b20[0x2d];
    auVar158._0_8_ = alStack_10b20[0x2c];
    auVar158._16_8_ = alStack_10b20[0x2e];
    auVar158._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar158);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar157._8_8_ = alStack_10b20[0x31];
    auVar157._0_8_ = alStack_10b20[0x30];
    auVar157._16_8_ = alStack_10b20[0x32];
    auVar157._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar157);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar156._8_8_ = alStack_10b20[0x35];
    auVar156._0_8_ = alStack_10b20[0x34];
    auVar156._16_8_ = alStack_10b20[0x36];
    auVar156._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar156);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar155._8_8_ = alStack_10b20[0x39];
    auVar155._0_8_ = alStack_10b20[0x38];
    auVar155._16_8_ = alStack_10b20[0x3a];
    auVar155._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar155);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar154._8_8_ = alStack_10b20[0x3d];
    auVar154._0_8_ = alStack_10b20[0x3c];
    auVar154._16_8_ = alStack_10b20[0x3e];
    auVar154._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar154);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(6));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 7;
    auVar153._8_8_ = alStack_10b20[1];
    auVar153._0_8_ = alStack_10b20[0];
    auVar153._16_8_ = alStack_10b20[2];
    auVar153._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar153);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar152._8_8_ = alStack_10b20[5];
    auVar152._0_8_ = alStack_10b20[4];
    auVar152._16_8_ = alStack_10b20[6];
    auVar152._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar152);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar151._8_8_ = alStack_10b20[9];
    auVar151._0_8_ = alStack_10b20[8];
    auVar151._16_8_ = alStack_10b20[10];
    auVar151._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar151);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar150._8_8_ = alStack_10b20[0xd];
    auVar150._0_8_ = alStack_10b20[0xc];
    auVar150._16_8_ = alStack_10b20[0xe];
    auVar150._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar150);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar149._8_8_ = alStack_10b20[0x11];
    auVar149._0_8_ = alStack_10b20[0x10];
    auVar149._16_8_ = alStack_10b20[0x12];
    auVar149._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar149);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar148._8_8_ = alStack_10b20[0x15];
    auVar148._0_8_ = alStack_10b20[0x14];
    auVar148._16_8_ = alStack_10b20[0x16];
    auVar148._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar148);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar147._8_8_ = alStack_10b20[0x19];
    auVar147._0_8_ = alStack_10b20[0x18];
    auVar147._16_8_ = alStack_10b20[0x1a];
    auVar147._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar147);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar146._8_8_ = alStack_10b20[0x1d];
    auVar146._0_8_ = alStack_10b20[0x1c];
    auVar146._16_8_ = alStack_10b20[0x1e];
    auVar146._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar146);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar145._8_8_ = alStack_10b20[0x21];
    auVar145._0_8_ = alStack_10b20[0x20];
    auVar145._16_8_ = alStack_10b20[0x22];
    auVar145._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar145);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar144._8_8_ = alStack_10b20[0x25];
    auVar144._0_8_ = alStack_10b20[0x24];
    auVar144._16_8_ = alStack_10b20[0x26];
    auVar144._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar144);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar143._8_8_ = alStack_10b20[0x29];
    auVar143._0_8_ = alStack_10b20[0x28];
    auVar143._16_8_ = alStack_10b20[0x2a];
    auVar143._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar143);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar142._8_8_ = alStack_10b20[0x2d];
    auVar142._0_8_ = alStack_10b20[0x2c];
    auVar142._16_8_ = alStack_10b20[0x2e];
    auVar142._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar142);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar141._8_8_ = alStack_10b20[0x31];
    auVar141._0_8_ = alStack_10b20[0x30];
    auVar141._16_8_ = alStack_10b20[0x32];
    auVar141._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar141);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar140._8_8_ = alStack_10b20[0x35];
    auVar140._0_8_ = alStack_10b20[0x34];
    auVar140._16_8_ = alStack_10b20[0x36];
    auVar140._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar140);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar139._8_8_ = alStack_10b20[0x39];
    auVar139._0_8_ = alStack_10b20[0x38];
    auVar139._16_8_ = alStack_10b20[0x3a];
    auVar139._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar139);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar138._8_8_ = alStack_10b20[0x3d];
    auVar138._0_8_ = alStack_10b20[0x3c];
    auVar138._16_8_ = alStack_10b20[0x3e];
    auVar138._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar138);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(7));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 8;
    auVar137._8_8_ = alStack_10b20[1];
    auVar137._0_8_ = alStack_10b20[0];
    auVar137._16_8_ = alStack_10b20[2];
    auVar137._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar137);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar136._8_8_ = alStack_10b20[5];
    auVar136._0_8_ = alStack_10b20[4];
    auVar136._16_8_ = alStack_10b20[6];
    auVar136._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar136);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar135._8_8_ = alStack_10b20[9];
    auVar135._0_8_ = alStack_10b20[8];
    auVar135._16_8_ = alStack_10b20[10];
    auVar135._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar135);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar134._8_8_ = alStack_10b20[0xd];
    auVar134._0_8_ = alStack_10b20[0xc];
    auVar134._16_8_ = alStack_10b20[0xe];
    auVar134._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar134);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar133._8_8_ = alStack_10b20[0x11];
    auVar133._0_8_ = alStack_10b20[0x10];
    auVar133._16_8_ = alStack_10b20[0x12];
    auVar133._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar133);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar132._8_8_ = alStack_10b20[0x15];
    auVar132._0_8_ = alStack_10b20[0x14];
    auVar132._16_8_ = alStack_10b20[0x16];
    auVar132._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar132);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar131._8_8_ = alStack_10b20[0x19];
    auVar131._0_8_ = alStack_10b20[0x18];
    auVar131._16_8_ = alStack_10b20[0x1a];
    auVar131._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar131);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar130._8_8_ = alStack_10b20[0x1d];
    auVar130._0_8_ = alStack_10b20[0x1c];
    auVar130._16_8_ = alStack_10b20[0x1e];
    auVar130._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar130);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar129._8_8_ = alStack_10b20[0x21];
    auVar129._0_8_ = alStack_10b20[0x20];
    auVar129._16_8_ = alStack_10b20[0x22];
    auVar129._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar129);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar128._8_8_ = alStack_10b20[0x25];
    auVar128._0_8_ = alStack_10b20[0x24];
    auVar128._16_8_ = alStack_10b20[0x26];
    auVar128._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar128);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar127._8_8_ = alStack_10b20[0x29];
    auVar127._0_8_ = alStack_10b20[0x28];
    auVar127._16_8_ = alStack_10b20[0x2a];
    auVar127._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar127);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar126._8_8_ = alStack_10b20[0x2d];
    auVar126._0_8_ = alStack_10b20[0x2c];
    auVar126._16_8_ = alStack_10b20[0x2e];
    auVar126._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar126);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar125._8_8_ = alStack_10b20[0x31];
    auVar125._0_8_ = alStack_10b20[0x30];
    auVar125._16_8_ = alStack_10b20[0x32];
    auVar125._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar125);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar124._8_8_ = alStack_10b20[0x35];
    auVar124._0_8_ = alStack_10b20[0x34];
    auVar124._16_8_ = alStack_10b20[0x36];
    auVar124._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar124);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar123._8_8_ = alStack_10b20[0x39];
    auVar123._0_8_ = alStack_10b20[0x38];
    auVar123._16_8_ = alStack_10b20[0x3a];
    auVar123._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar123);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar122._8_8_ = alStack_10b20[0x3d];
    auVar122._0_8_ = alStack_10b20[0x3c];
    auVar122._16_8_ = alStack_10b20[0x3e];
    auVar122._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar122);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(8));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 9;
    auVar121._8_8_ = alStack_10b20[1];
    auVar121._0_8_ = alStack_10b20[0];
    auVar121._16_8_ = alStack_10b20[2];
    auVar121._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar121);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar120._8_8_ = alStack_10b20[5];
    auVar120._0_8_ = alStack_10b20[4];
    auVar120._16_8_ = alStack_10b20[6];
    auVar120._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar120);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar119._8_8_ = alStack_10b20[9];
    auVar119._0_8_ = alStack_10b20[8];
    auVar119._16_8_ = alStack_10b20[10];
    auVar119._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar119);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar118._8_8_ = alStack_10b20[0xd];
    auVar118._0_8_ = alStack_10b20[0xc];
    auVar118._16_8_ = alStack_10b20[0xe];
    auVar118._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar118);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar117._8_8_ = alStack_10b20[0x11];
    auVar117._0_8_ = alStack_10b20[0x10];
    auVar117._16_8_ = alStack_10b20[0x12];
    auVar117._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar117);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar116._8_8_ = alStack_10b20[0x15];
    auVar116._0_8_ = alStack_10b20[0x14];
    auVar116._16_8_ = alStack_10b20[0x16];
    auVar116._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar116);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar115._8_8_ = alStack_10b20[0x19];
    auVar115._0_8_ = alStack_10b20[0x18];
    auVar115._16_8_ = alStack_10b20[0x1a];
    auVar115._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar115);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar114._8_8_ = alStack_10b20[0x1d];
    auVar114._0_8_ = alStack_10b20[0x1c];
    auVar114._16_8_ = alStack_10b20[0x1e];
    auVar114._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar114);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar113._8_8_ = alStack_10b20[0x21];
    auVar113._0_8_ = alStack_10b20[0x20];
    auVar113._16_8_ = alStack_10b20[0x22];
    auVar113._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar113);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar112._8_8_ = alStack_10b20[0x25];
    auVar112._0_8_ = alStack_10b20[0x24];
    auVar112._16_8_ = alStack_10b20[0x26];
    auVar112._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar112);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar111._8_8_ = alStack_10b20[0x29];
    auVar111._0_8_ = alStack_10b20[0x28];
    auVar111._16_8_ = alStack_10b20[0x2a];
    auVar111._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar111);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar110._8_8_ = alStack_10b20[0x2d];
    auVar110._0_8_ = alStack_10b20[0x2c];
    auVar110._16_8_ = alStack_10b20[0x2e];
    auVar110._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar110);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar109._8_8_ = alStack_10b20[0x31];
    auVar109._0_8_ = alStack_10b20[0x30];
    auVar109._16_8_ = alStack_10b20[0x32];
    auVar109._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar109);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar108._8_8_ = alStack_10b20[0x35];
    auVar108._0_8_ = alStack_10b20[0x34];
    auVar108._16_8_ = alStack_10b20[0x36];
    auVar108._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar108);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar107._8_8_ = alStack_10b20[0x39];
    auVar107._0_8_ = alStack_10b20[0x38];
    auVar107._16_8_ = alStack_10b20[0x3a];
    auVar107._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar107);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar106._8_8_ = alStack_10b20[0x3d];
    auVar106._0_8_ = alStack_10b20[0x3c];
    auVar106._16_8_ = alStack_10b20[0x3e];
    auVar106._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar106);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 10;
    auVar105._8_8_ = alStack_10b20[1];
    auVar105._0_8_ = alStack_10b20[0];
    auVar105._16_8_ = alStack_10b20[2];
    auVar105._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar105);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar104._8_8_ = alStack_10b20[5];
    auVar104._0_8_ = alStack_10b20[4];
    auVar104._16_8_ = alStack_10b20[6];
    auVar104._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar104);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar103._8_8_ = alStack_10b20[9];
    auVar103._0_8_ = alStack_10b20[8];
    auVar103._16_8_ = alStack_10b20[10];
    auVar103._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar103);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar102._8_8_ = alStack_10b20[0xd];
    auVar102._0_8_ = alStack_10b20[0xc];
    auVar102._16_8_ = alStack_10b20[0xe];
    auVar102._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar102);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar101._8_8_ = alStack_10b20[0x11];
    auVar101._0_8_ = alStack_10b20[0x10];
    auVar101._16_8_ = alStack_10b20[0x12];
    auVar101._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar101);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar100._8_8_ = alStack_10b20[0x15];
    auVar100._0_8_ = alStack_10b20[0x14];
    auVar100._16_8_ = alStack_10b20[0x16];
    auVar100._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar100);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar99._8_8_ = alStack_10b20[0x19];
    auVar99._0_8_ = alStack_10b20[0x18];
    auVar99._16_8_ = alStack_10b20[0x1a];
    auVar99._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar99);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar98._8_8_ = alStack_10b20[0x1d];
    auVar98._0_8_ = alStack_10b20[0x1c];
    auVar98._16_8_ = alStack_10b20[0x1e];
    auVar98._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar98);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar97._8_8_ = alStack_10b20[0x21];
    auVar97._0_8_ = alStack_10b20[0x20];
    auVar97._16_8_ = alStack_10b20[0x22];
    auVar97._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar97);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar96._8_8_ = alStack_10b20[0x25];
    auVar96._0_8_ = alStack_10b20[0x24];
    auVar96._16_8_ = alStack_10b20[0x26];
    auVar96._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar96);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar95._8_8_ = alStack_10b20[0x29];
    auVar95._0_8_ = alStack_10b20[0x28];
    auVar95._16_8_ = alStack_10b20[0x2a];
    auVar95._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar95);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar94._8_8_ = alStack_10b20[0x2d];
    auVar94._0_8_ = alStack_10b20[0x2c];
    auVar94._16_8_ = alStack_10b20[0x2e];
    auVar94._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar94);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar93._8_8_ = alStack_10b20[0x31];
    auVar93._0_8_ = alStack_10b20[0x30];
    auVar93._16_8_ = alStack_10b20[0x32];
    auVar93._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar93);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar92._8_8_ = alStack_10b20[0x35];
    auVar92._0_8_ = alStack_10b20[0x34];
    auVar92._16_8_ = alStack_10b20[0x36];
    auVar92._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar92);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar91._8_8_ = alStack_10b20[0x39];
    auVar91._0_8_ = alStack_10b20[0x38];
    auVar91._16_8_ = alStack_10b20[0x3a];
    auVar91._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar91);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar90._8_8_ = alStack_10b20[0x3d];
    auVar90._0_8_ = alStack_10b20[0x3c];
    auVar90._16_8_ = alStack_10b20[0x3e];
    auVar90._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar90);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(10));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 0xb;
    auVar89._8_8_ = alStack_10b20[1];
    auVar89._0_8_ = alStack_10b20[0];
    auVar89._16_8_ = alStack_10b20[2];
    auVar89._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar89);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar88._8_8_ = alStack_10b20[5];
    auVar88._0_8_ = alStack_10b20[4];
    auVar88._16_8_ = alStack_10b20[6];
    auVar88._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar88);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar87._8_8_ = alStack_10b20[9];
    auVar87._0_8_ = alStack_10b20[8];
    auVar87._16_8_ = alStack_10b20[10];
    auVar87._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar87);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar86._8_8_ = alStack_10b20[0xd];
    auVar86._0_8_ = alStack_10b20[0xc];
    auVar86._16_8_ = alStack_10b20[0xe];
    auVar86._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar86);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar85._8_8_ = alStack_10b20[0x11];
    auVar85._0_8_ = alStack_10b20[0x10];
    auVar85._16_8_ = alStack_10b20[0x12];
    auVar85._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar85);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar84._8_8_ = alStack_10b20[0x15];
    auVar84._0_8_ = alStack_10b20[0x14];
    auVar84._16_8_ = alStack_10b20[0x16];
    auVar84._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar84);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar83._8_8_ = alStack_10b20[0x19];
    auVar83._0_8_ = alStack_10b20[0x18];
    auVar83._16_8_ = alStack_10b20[0x1a];
    auVar83._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar83);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar82._8_8_ = alStack_10b20[0x1d];
    auVar82._0_8_ = alStack_10b20[0x1c];
    auVar82._16_8_ = alStack_10b20[0x1e];
    auVar82._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar82);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar81._8_8_ = alStack_10b20[0x21];
    auVar81._0_8_ = alStack_10b20[0x20];
    auVar81._16_8_ = alStack_10b20[0x22];
    auVar81._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar81);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar80._8_8_ = alStack_10b20[0x25];
    auVar80._0_8_ = alStack_10b20[0x24];
    auVar80._16_8_ = alStack_10b20[0x26];
    auVar80._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar80);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar79._8_8_ = alStack_10b20[0x29];
    auVar79._0_8_ = alStack_10b20[0x28];
    auVar79._16_8_ = alStack_10b20[0x2a];
    auVar79._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar79);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar78._8_8_ = alStack_10b20[0x2d];
    auVar78._0_8_ = alStack_10b20[0x2c];
    auVar78._16_8_ = alStack_10b20[0x2e];
    auVar78._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar78);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar77._8_8_ = alStack_10b20[0x31];
    auVar77._0_8_ = alStack_10b20[0x30];
    auVar77._16_8_ = alStack_10b20[0x32];
    auVar77._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar77);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar76._8_8_ = alStack_10b20[0x35];
    auVar76._0_8_ = alStack_10b20[0x34];
    auVar76._16_8_ = alStack_10b20[0x36];
    auVar76._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar76);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar75._8_8_ = alStack_10b20[0x39];
    auVar75._0_8_ = alStack_10b20[0x38];
    auVar75._16_8_ = alStack_10b20[0x3a];
    auVar75._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar75);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar74._8_8_ = alStack_10b20[0x3d];
    auVar74._0_8_ = alStack_10b20[0x3c];
    auVar74._16_8_ = alStack_10b20[0x3e];
    auVar74._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar74);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xb));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 0xc;
    auVar73._8_8_ = alStack_10b20[1];
    auVar73._0_8_ = alStack_10b20[0];
    auVar73._16_8_ = alStack_10b20[2];
    auVar73._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar73);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar72._8_8_ = alStack_10b20[5];
    auVar72._0_8_ = alStack_10b20[4];
    auVar72._16_8_ = alStack_10b20[6];
    auVar72._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar72);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar71._8_8_ = alStack_10b20[9];
    auVar71._0_8_ = alStack_10b20[8];
    auVar71._16_8_ = alStack_10b20[10];
    auVar71._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar71);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar70._8_8_ = alStack_10b20[0xd];
    auVar70._0_8_ = alStack_10b20[0xc];
    auVar70._16_8_ = alStack_10b20[0xe];
    auVar70._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar70);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar69._8_8_ = alStack_10b20[0x11];
    auVar69._0_8_ = alStack_10b20[0x10];
    auVar69._16_8_ = alStack_10b20[0x12];
    auVar69._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar69);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar68._8_8_ = alStack_10b20[0x15];
    auVar68._0_8_ = alStack_10b20[0x14];
    auVar68._16_8_ = alStack_10b20[0x16];
    auVar68._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar68);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar67._8_8_ = alStack_10b20[0x19];
    auVar67._0_8_ = alStack_10b20[0x18];
    auVar67._16_8_ = alStack_10b20[0x1a];
    auVar67._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar67);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar66._8_8_ = alStack_10b20[0x1d];
    auVar66._0_8_ = alStack_10b20[0x1c];
    auVar66._16_8_ = alStack_10b20[0x1e];
    auVar66._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar66);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar65._8_8_ = alStack_10b20[0x21];
    auVar65._0_8_ = alStack_10b20[0x20];
    auVar65._16_8_ = alStack_10b20[0x22];
    auVar65._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar65);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar64._8_8_ = alStack_10b20[0x25];
    auVar64._0_8_ = alStack_10b20[0x24];
    auVar64._16_8_ = alStack_10b20[0x26];
    auVar64._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar64);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar63._8_8_ = alStack_10b20[0x29];
    auVar63._0_8_ = alStack_10b20[0x28];
    auVar63._16_8_ = alStack_10b20[0x2a];
    auVar63._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar63);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar62._8_8_ = alStack_10b20[0x2d];
    auVar62._0_8_ = alStack_10b20[0x2c];
    auVar62._16_8_ = alStack_10b20[0x2e];
    auVar62._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar62);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar61._8_8_ = alStack_10b20[0x31];
    auVar61._0_8_ = alStack_10b20[0x30];
    auVar61._16_8_ = alStack_10b20[0x32];
    auVar61._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar61);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar60._8_8_ = alStack_10b20[0x35];
    auVar60._0_8_ = alStack_10b20[0x34];
    auVar60._16_8_ = alStack_10b20[0x36];
    auVar60._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar60);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar59._8_8_ = alStack_10b20[0x39];
    auVar59._0_8_ = alStack_10b20[0x38];
    auVar59._16_8_ = alStack_10b20[0x3a];
    auVar59._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar59);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar58._8_8_ = alStack_10b20[0x3d];
    auVar58._0_8_ = alStack_10b20[0x3c];
    auVar58._16_8_ = alStack_10b20[0x3e];
    auVar58._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar58);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xc));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 0xd;
    auVar57._8_8_ = alStack_10b20[1];
    auVar57._0_8_ = alStack_10b20[0];
    auVar57._16_8_ = alStack_10b20[2];
    auVar57._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar57);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar56._8_8_ = alStack_10b20[5];
    auVar56._0_8_ = alStack_10b20[4];
    auVar56._16_8_ = alStack_10b20[6];
    auVar56._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar56);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar55._8_8_ = alStack_10b20[9];
    auVar55._0_8_ = alStack_10b20[8];
    auVar55._16_8_ = alStack_10b20[10];
    auVar55._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar55);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar54._8_8_ = alStack_10b20[0xd];
    auVar54._0_8_ = alStack_10b20[0xc];
    auVar54._16_8_ = alStack_10b20[0xe];
    auVar54._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar54);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar53._8_8_ = alStack_10b20[0x11];
    auVar53._0_8_ = alStack_10b20[0x10];
    auVar53._16_8_ = alStack_10b20[0x12];
    auVar53._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar53);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar52._8_8_ = alStack_10b20[0x15];
    auVar52._0_8_ = alStack_10b20[0x14];
    auVar52._16_8_ = alStack_10b20[0x16];
    auVar52._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar52);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar51._8_8_ = alStack_10b20[0x19];
    auVar51._0_8_ = alStack_10b20[0x18];
    auVar51._16_8_ = alStack_10b20[0x1a];
    auVar51._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar51);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar50._8_8_ = alStack_10b20[0x1d];
    auVar50._0_8_ = alStack_10b20[0x1c];
    auVar50._16_8_ = alStack_10b20[0x1e];
    auVar50._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar50);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar49._8_8_ = alStack_10b20[0x21];
    auVar49._0_8_ = alStack_10b20[0x20];
    auVar49._16_8_ = alStack_10b20[0x22];
    auVar49._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar49);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar48._8_8_ = alStack_10b20[0x25];
    auVar48._0_8_ = alStack_10b20[0x24];
    auVar48._16_8_ = alStack_10b20[0x26];
    auVar48._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar48);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar47._8_8_ = alStack_10b20[0x29];
    auVar47._0_8_ = alStack_10b20[0x28];
    auVar47._16_8_ = alStack_10b20[0x2a];
    auVar47._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar47);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar46._8_8_ = alStack_10b20[0x2d];
    auVar46._0_8_ = alStack_10b20[0x2c];
    auVar46._16_8_ = alStack_10b20[0x2e];
    auVar46._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar46);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar45._8_8_ = alStack_10b20[0x31];
    auVar45._0_8_ = alStack_10b20[0x30];
    auVar45._16_8_ = alStack_10b20[0x32];
    auVar45._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar45);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar44._8_8_ = alStack_10b20[0x35];
    auVar44._0_8_ = alStack_10b20[0x34];
    auVar44._16_8_ = alStack_10b20[0x36];
    auVar44._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar44);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar43._8_8_ = alStack_10b20[0x39];
    auVar43._0_8_ = alStack_10b20[0x38];
    auVar43._16_8_ = alStack_10b20[0x3a];
    auVar43._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar43);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar42._8_8_ = alStack_10b20[0x3d];
    auVar42._0_8_ = alStack_10b20[0x3c];
    auVar42._16_8_ = alStack_10b20[0x3e];
    auVar42._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar42);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xd));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 0xe;
    auVar41._8_8_ = alStack_10b20[1];
    auVar41._0_8_ = alStack_10b20[0];
    auVar41._16_8_ = alStack_10b20[2];
    auVar41._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar41);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar40._8_8_ = alStack_10b20[5];
    auVar40._0_8_ = alStack_10b20[4];
    auVar40._16_8_ = alStack_10b20[6];
    auVar40._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar40);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar3 = vpor_avx2(auVar3,auVar1);
    auVar39._8_8_ = alStack_10b20[9];
    auVar39._0_8_ = alStack_10b20[8];
    auVar39._16_8_ = alStack_10b20[10];
    auVar39._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar39);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar4 = vpor_avx2(auVar4,auVar1);
    auVar38._8_8_ = alStack_10b20[0xd];
    auVar38._0_8_ = alStack_10b20[0xc];
    auVar38._16_8_ = alStack_10b20[0xe];
    auVar38._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar38);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar5 = vpor_avx2(auVar5,auVar1);
    auVar37._8_8_ = alStack_10b20[0x11];
    auVar37._0_8_ = alStack_10b20[0x10];
    auVar37._16_8_ = alStack_10b20[0x12];
    auVar37._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar37);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar6 = vpor_avx2(auVar6,auVar1);
    auVar36._8_8_ = alStack_10b20[0x15];
    auVar36._0_8_ = alStack_10b20[0x14];
    auVar36._16_8_ = alStack_10b20[0x16];
    auVar36._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar36);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar7 = vpor_avx2(auVar7,auVar1);
    auVar35._8_8_ = alStack_10b20[0x19];
    auVar35._0_8_ = alStack_10b20[0x18];
    auVar35._16_8_ = alStack_10b20[0x1a];
    auVar35._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar35);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar8 = vpor_avx2(auVar8,auVar1);
    auVar34._8_8_ = alStack_10b20[0x1d];
    auVar34._0_8_ = alStack_10b20[0x1c];
    auVar34._16_8_ = alStack_10b20[0x1e];
    auVar34._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar34);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar9 = vpor_avx2(auVar9,auVar1);
    auVar33._8_8_ = alStack_10b20[0x21];
    auVar33._0_8_ = alStack_10b20[0x20];
    auVar33._16_8_ = alStack_10b20[0x22];
    auVar33._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar33);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar10 = vpor_avx2(auVar10,auVar1);
    auVar32._8_8_ = alStack_10b20[0x25];
    auVar32._0_8_ = alStack_10b20[0x24];
    auVar32._16_8_ = alStack_10b20[0x26];
    auVar32._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar32);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar11 = vpor_avx2(auVar11,auVar1);
    auVar31._8_8_ = alStack_10b20[0x29];
    auVar31._0_8_ = alStack_10b20[0x28];
    auVar31._16_8_ = alStack_10b20[0x2a];
    auVar31._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar31);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar12 = vpor_avx2(auVar12,auVar1);
    auVar30._8_8_ = alStack_10b20[0x2d];
    auVar30._0_8_ = alStack_10b20[0x2c];
    auVar30._16_8_ = alStack_10b20[0x2e];
    auVar30._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar30);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar13 = vpor_avx2(auVar13,auVar1);
    auVar29._8_8_ = alStack_10b20[0x31];
    auVar29._0_8_ = alStack_10b20[0x30];
    auVar29._16_8_ = alStack_10b20[0x32];
    auVar29._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar29);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar14 = vpor_avx2(auVar14,auVar1);
    auVar28._8_8_ = alStack_10b20[0x35];
    auVar28._0_8_ = alStack_10b20[0x34];
    auVar28._16_8_ = alStack_10b20[0x36];
    auVar28._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar28);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar15 = vpor_avx2(auVar15,auVar1);
    auVar27._8_8_ = alStack_10b20[0x39];
    auVar27._0_8_ = alStack_10b20[0x38];
    auVar27._16_8_ = alStack_10b20[0x3a];
    auVar27._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar27);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar16 = vpor_avx2(auVar16,auVar1);
    auVar26._8_8_ = alStack_10b20[0x3d];
    auVar26._0_8_ = alStack_10b20[0x3c];
    auVar26._16_8_ = alStack_10b20[0x3e];
    auVar26._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar26);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar17 = vpor_avx2(auVar17,auVar1);
    uVar257 = uStack_10d84 + 0xf;
    auVar25._8_8_ = alStack_10b20[1];
    auVar25._0_8_ = alStack_10b20[0];
    auVar25._16_8_ = alStack_10b20[2];
    auVar25._24_8_ = alStack_10b20[3];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar25);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10d20 = vpor_avx2(auVar2,auVar1);
    auVar24._8_8_ = alStack_10b20[5];
    auVar24._0_8_ = alStack_10b20[4];
    auVar24._16_8_ = alStack_10b20[6];
    auVar24._24_8_ = alStack_10b20[7];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar24);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10d00 = vpor_avx2(auVar3,auVar1);
    auVar23._8_8_ = alStack_10b20[9];
    auVar23._0_8_ = alStack_10b20[8];
    auVar23._16_8_ = alStack_10b20[10];
    auVar23._24_8_ = alStack_10b20[0xb];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar23);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10ce0 = vpor_avx2(auVar4,auVar1);
    auVar22._8_8_ = alStack_10b20[0xd];
    auVar22._0_8_ = alStack_10b20[0xc];
    auVar22._16_8_ = alStack_10b20[0xe];
    auVar22._24_8_ = alStack_10b20[0xf];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar22);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(3));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10cc0 = vpor_avx2(auVar5,auVar1);
    auVar21._8_8_ = alStack_10b20[0x11];
    auVar21._0_8_ = alStack_10b20[0x10];
    auVar21._16_8_ = alStack_10b20[0x12];
    auVar21._24_8_ = alStack_10b20[0x13];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar21);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(4));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10ca0 = vpor_avx2(auVar6,auVar1);
    auVar20._8_8_ = alStack_10b20[0x15];
    auVar20._0_8_ = alStack_10b20[0x14];
    auVar20._16_8_ = alStack_10b20[0x16];
    auVar20._24_8_ = alStack_10b20[0x17];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar20);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(5));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10c80 = vpor_avx2(auVar7,auVar1);
    auVar19._8_8_ = alStack_10b20[0x19];
    auVar19._0_8_ = alStack_10b20[0x18];
    auVar19._16_8_ = alStack_10b20[0x1a];
    auVar19._24_8_ = alStack_10b20[0x1b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar19);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(6));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10c60 = vpor_avx2(auVar8,auVar1);
    auVar18._8_8_ = alStack_10b20[0x1d];
    auVar18._0_8_ = alStack_10b20[0x1c];
    auVar18._16_8_ = alStack_10b20[0x1e];
    auVar18._24_8_ = alStack_10b20[0x1f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar18);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(7));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10c40 = vpor_avx2(auVar9,auVar1);
    auVar8._8_8_ = alStack_10b20[0x21];
    auVar8._0_8_ = alStack_10b20[0x20];
    auVar8._16_8_ = alStack_10b20[0x22];
    auVar8._24_8_ = alStack_10b20[0x23];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar8);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(8));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10c20 = vpor_avx2(auVar10,auVar1);
    auVar7._8_8_ = alStack_10b20[0x25];
    auVar7._0_8_ = alStack_10b20[0x24];
    auVar7._16_8_ = alStack_10b20[0x26];
    auVar7._24_8_ = alStack_10b20[0x27];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar7);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(9));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10c00 = vpor_avx2(auVar11,auVar1);
    auVar6._8_8_ = alStack_10b20[0x29];
    auVar6._0_8_ = alStack_10b20[0x28];
    auVar6._16_8_ = alStack_10b20[0x2a];
    auVar6._24_8_ = alStack_10b20[0x2b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar6);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(10));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10be0 = vpor_avx2(auVar12,auVar1);
    auVar5._8_8_ = alStack_10b20[0x2d];
    auVar5._0_8_ = alStack_10b20[0x2c];
    auVar5._16_8_ = alStack_10b20[0x2e];
    auVar5._24_8_ = alStack_10b20[0x2f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar5);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xb));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10bc0 = vpor_avx2(auVar13,auVar1);
    auVar4._8_8_ = alStack_10b20[0x31];
    auVar4._0_8_ = alStack_10b20[0x30];
    auVar4._16_8_ = alStack_10b20[0x32];
    auVar4._24_8_ = alStack_10b20[0x33];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar4);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xc));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10ba0 = vpor_avx2(auVar14,auVar1);
    auVar3._8_8_ = alStack_10b20[0x35];
    auVar3._0_8_ = alStack_10b20[0x34];
    auVar3._16_8_ = alStack_10b20[0x36];
    auVar3._24_8_ = alStack_10b20[0x37];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar3);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xd));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10b80 = vpor_avx2(auVar15,auVar1);
    auVar2._8_8_ = alStack_10b20[0x39];
    auVar2._0_8_ = alStack_10b20[0x38];
    auVar2._16_8_ = alStack_10b20[0x3a];
    auVar2._24_8_ = alStack_10b20[0x3b];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar2);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10b60 = vpor_avx2(auVar16,auVar1);
    auVar1._8_8_ = alStack_10b20[0x3d];
    auVar1._0_8_ = alStack_10b20[0x3c];
    auVar1._16_8_ = alStack_10b20[0x3e];
    auVar1._24_8_ = alStack_10b20[0x3f];
    auVar1 = vpand_avx2(*(undefined1 (*) [32])(lStack_10910 + (ulong)uVar257 * 0x20),auVar1);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xf));
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(0xf));
    auStack_10b40 = vpor_avx2(auVar17,auVar1);
    uStack_10d84 = uStack_10d84 + 0x10;
    for (iStack_10d94 = 0; iStack_10d94 < 0x10; iStack_10d94 = iStack_10d94 + 1) {
      lVar258 = (long)iStack_10d94;
      aiStack_10d70[lVar258] =
           aiStack_10d70[lVar258] + (int)POPCOUNT(*(undefined8 *)(auStack_10d20 + lVar258 * 0x20));
      lVar258 = (long)iStack_10d94;
      aiStack_10d70[lVar258] =
           aiStack_10d70[lVar258] +
           (int)POPCOUNT(*(undefined8 *)(auStack_10d20 + lVar258 * 0x20 + 8));
      lVar258 = (long)iStack_10d94;
      aiStack_10d70[lVar258] =
           aiStack_10d70[lVar258] +
           (int)POPCOUNT(*(undefined8 *)(auStack_10d20 + lVar258 * 0x20 + 0x10));
      lVar258 = (long)iStack_10d94;
      aiStack_10d70[lVar258] =
           aiStack_10d70[lVar258] +
           (int)POPCOUNT(*(undefined8 *)(auStack_10d00 + lVar258 * 0x20 + -8));
      auVar260 = vpinsrw_avx(ZEXT216(0),0,1);
      auVar260 = vpinsrw_avx(auVar260,0,2);
      auVar260 = vpinsrw_avx(auVar260,0,3);
      auVar260 = vpinsrw_avx(auVar260,0,4);
      auVar260 = vpinsrw_avx(auVar260,0,5);
      auVar260 = vpinsrw_avx(auVar260,0,6);
      auVar260 = vpinsrw_avx(auVar260,0,7);
      auVar259 = vpinsrw_avx(ZEXT216(0),0,1);
      auVar259 = vpinsrw_avx(auVar259,0,2);
      auVar259 = vpinsrw_avx(auVar259,0,3);
      auVar259 = vpinsrw_avx(auVar259,0,4);
      auVar259 = vpinsrw_avx(auVar259,0,5);
      auVar259 = vpinsrw_avx(auVar259,0,6);
      auVar259 = vpinsrw_avx(auVar259,0,7);
      auVar259 = ZEXT116(0) * auVar260 + ZEXT116(1) * auVar259;
      auVar260 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar260;
      local_80 = auVar259._0_8_;
      uStack_78 = auVar259._8_8_;
      uStack_70 = auVar260._0_8_;
      uStack_68 = auVar260._8_8_;
      lVar258 = (long)iStack_10d94 * 0x20;
      *(undefined8 *)(auStack_10d20 + lVar258) = local_80;
      *(undefined8 *)(auStack_10d20 + lVar258 + 8) = uStack_78;
      *(undefined8 *)(auStack_10d20 + lVar258 + 0x10) = uStack_70;
      *(undefined8 *)(auStack_10d00 + lVar258 + -8) = uStack_68;
    }
  }
  for (uStack_10da0 = (ulong)(uStack_10d84 << 4); uStack_10da0 < uStack_10914;
      uStack_10da0 = uStack_10da0 + 1) {
    for (iStack_10da4 = 0; iStack_10da4 < 0x10; iStack_10da4 = iStack_10da4 + 1) {
      aiStack_10d70[iStack_10da4] =
           ((int)((uint)*(ushort *)(lStack_10910 + uStack_10da0 * 2) &
                 1 << ((byte)iStack_10da4 & 0x1f)) >> ((byte)iStack_10da4 & 0x1f)) +
           aiStack_10d70[iStack_10da4];
    }
  }
  for (iStack_10da8 = 0; iStack_10da8 < 0x10; iStack_10da8 = iStack_10da8 + 1) {
    *(int *)(alStack_10b20[0x40] + (long)iStack_10da8 * 4) = aiStack_10d70[iStack_10da8];
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_popcnt(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i masks[16];
    __m256i stubs[16];
    for (int i = 0; i < 16; ++i) {
        masks[i] = _mm256_set1_epi16(1 << i);
        stubs[i] = _mm256_set1_epi16(0);
    }

    uint32_t out_counters[16] = {0};

    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_cycles_updates = n_cycles / 16;

#define UPDATE(idx, shift) stubs[idx] = _mm256_or_si256(stubs[idx], _mm256_slli_epi16(_mm256_srli_epi16(_mm256_and_si256(_mm256_loadu_si256(data_vectors+pos), masks[idx]),  idx), shift));
#define ITERATION(idx) {                                           \
    UPDATE(0,idx);  UPDATE(1,idx);  UPDATE(2,idx);  UPDATE(3,idx); \
    UPDATE(4,idx);  UPDATE(5,idx);  UPDATE(6,idx);  UPDATE(7,idx); \
    UPDATE(8,idx);  UPDATE(9,idx);  UPDATE(10,idx); UPDATE(11,idx);\
    UPDATE(12,idx); UPDATE(13,idx); UPDATE(14,idx); UPDATE(15,idx);\
    ++pos;                                                         \
}
#define BLOCK {                                                \
    ITERATION(0);  ITERATION(1);  ITERATION(2);  ITERATION(3); \
    ITERATION(4);  ITERATION(5);  ITERATION(6);  ITERATION(7); \
    ITERATION(8);  ITERATION(9);  ITERATION(10); ITERATION(11);\
    ITERATION(12); ITERATION(13); ITERATION(14); ITERATION(15);\
}

    uint32_t pos = 0;
    for (size_t i = 0; i < n_cycles_updates; ++i) {
        BLOCK // unrolled
        
        // Not unrolled
        /*
        for (int c = 0; c < 16; ++c) { // 16 iterations per register
            ITERATION(c)
            // for (int j = 0; j < 16; ++j) { // each 1-hot per register
            //     UPDATE(j,c)
            // }
        }
        */

        for (int j = 0; j < 16; ++j) {
            PIL_POPCOUNT_AVX2(out_counters[j], stubs[j])
            stubs[j] = _mm256_set1_epi16(0);
        }
    }

    // residual
    for (size_t i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            out_counters[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    for (int i = 0; i < 16; ++i)
        flags[i] = out_counters[i];

#undef BLOCK
#undef ITERATION
#undef UPDATE

    return 0;
}